

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void White(void)

{
  std::operator<<((ostream *)&std::cout,"\x1b[49m\x1b[37m");
  return;
}

Assistant:

void White()
{
#ifdef _WIN32
	auto h = WinColor();
	SetConsoleTextAttribute(h, FOREGROUND_RED | FOREGROUND_GREEN | FOREGROUND_BLUE);
#else
	std::cout << "\033[49m\033[37m";
#endif
}